

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> *
__thiscall
QMultiHash<int,_QString>::equal_range_impl<int>
          (pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator>
           *__return_storage_ptr__,QMultiHash<int,_QString> *this,int *key)

{
  byte bVar1;
  Data *pDVar2;
  Entry *pEVar3;
  uchar *puVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  Bucket BVar6;
  iterator<QHashPrivate::MultiNode<int,_QString>_> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d != (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    BVar6 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::findBucket<int>(this->d,key)
    ;
    if ((BVar6.span)->offsets[BVar6.index] != 0xff) {
      pDVar2 = this->d;
      uVar5 = ((long)BVar6.span - (long)pDVar2->spans) / 0x90 << 7 | BVar6.index;
      local_40.d = pDVar2;
      local_40.bucket = uVar5;
      QHashPrivate::iterator<QHashPrivate::MultiNode<int,_QString>_>::operator++(&local_40);
      pEVar3 = pDVar2->spans[uVar5 >> 7].entries;
      bVar1 = pDVar2->spans[uVar5 >> 7].offsets[(uint)BVar6.index & 0x7f];
      if (local_40.d == (Data *)0x0) {
        puVar4 = (uchar *)0x0;
      }
      else {
        puVar4 = (local_40.d)->spans[local_40.bucket >> 7].entries
                 [(local_40.d)->spans[local_40.bucket >> 7].offsets[(uint)local_40.bucket & 0x7f]].
                 storage.data + 8;
      }
      (__return_storage_ptr__->first).i.d = pDVar2;
      (__return_storage_ptr__->first).i.bucket = uVar5;
      (__return_storage_ptr__->first).e = (Chain **)(pEVar3[bVar1].storage.data + 8);
      (__return_storage_ptr__->second).i.d = local_40.d;
      (__return_storage_ptr__->second).i.bucket = local_40.bucket;
      (__return_storage_ptr__->second).e = (Chain **)puVar4;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_003c9e40;
    }
  }
  (__return_storage_ptr__->first).e = (Chain **)0x0;
  (__return_storage_ptr__->first).i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0;
  (__return_storage_ptr__->first).i.bucket = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    (__return_storage_ptr__->second).i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0;
    (__return_storage_ptr__->second).i.bucket = 0;
    (__return_storage_ptr__->second).e = (Chain **)0x0;
    return __return_storage_ptr__;
  }
LAB_003c9e40:
  __stack_chk_fail();
}

Assistant:

std::pair<const_iterator, const_iterator> equal_range_impl(const K &key) const noexcept
    {
        if (!d)
            return {end(), end()};

        auto bucket = d->findBucket(key);
        if (bucket.isUnused())
            return {end(), end()};
        auto it = bucket.toIterator(d);
        auto end = it;
        ++end;
        return {const_iterator(it), const_iterator(end)};
    }